

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

xmlSchemaWildcardNsPtr xmlSchemaNewWildcardNsConstraint(xmlSchemaParserCtxtPtr ctxt)

{
  xmlSchemaWildcardNsPtr pxVar1;
  
  pxVar1 = (xmlSchemaWildcardNsPtr)(*xmlMalloc)(0x10);
  if (pxVar1 == (xmlSchemaWildcardNsPtr)0x0) {
    if (ctxt != (xmlSchemaParserCtxtPtr)0x0) {
      ctxt->nberrors = ctxt->nberrors + 1;
    }
    __xmlSimpleError(0x10,2,(xmlNodePtr)0x0,(char *)0x0,"creating wildcard namespace constraint");
  }
  else {
    pxVar1->next = (_xmlSchemaWildcardNs *)0x0;
    pxVar1->value = (xmlChar *)0x0;
  }
  return pxVar1;
}

Assistant:

static xmlSchemaWildcardNsPtr
xmlSchemaNewWildcardNsConstraint(xmlSchemaParserCtxtPtr ctxt)
{
    xmlSchemaWildcardNsPtr ret;

    ret = (xmlSchemaWildcardNsPtr)
	xmlMalloc(sizeof(xmlSchemaWildcardNs));
    if (ret == NULL) {
	xmlSchemaPErrMemory(ctxt, "creating wildcard namespace constraint", NULL);
	return (NULL);
    }
    ret->value = NULL;
    ret->next = NULL;
    return (ret);
}